

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_rc_get_default_min_gf_interval(int width,int height,double framerate)

{
  int in_ESI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  int default_interval;
  double factor;
  undefined4 local_28;
  undefined4 local_4;
  
  dVar1 = (double)in_EDI * (double)in_ESI * in_XMM0_Qa;
  local_28 = clamp((int)(in_XMM0_Qa * 0.125),4,0x20);
  local_4 = local_28;
  if (165888000.0 < dVar1) {
    if (local_28 <= (int)((dVar1 * 4.0) / 165888000.0 + 0.5)) {
      local_28 = (int)((dVar1 * 4.0) / 165888000.0 + 0.5);
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

int av1_rc_get_default_min_gf_interval(int width, int height,
                                       double framerate) {
  // Assume we do not need any constraint lower than 4K 20 fps
  static const double factor_safe = 3840 * 2160 * 20.0;
  const double factor = (double)width * height * framerate;
  const int default_interval =
      clamp((int)(framerate * 0.125), MIN_GF_INTERVAL, MAX_GF_INTERVAL);

  if (factor <= factor_safe)
    return default_interval;
  else
    return AOMMAX(default_interval,
                  (int)(MIN_GF_INTERVAL * factor / factor_safe + 0.5));
  // Note this logic makes:
  // 4K24: 5
  // 4K30: 6
  // 4K60: 12
}